

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64.c
# Opt level: O0

leaf_t * containerptr_roaring64_bitmap_remove
                   (roaring64_bitmap_t *r,uint8_t *high48,uint16_t low16,leaf_t *leaf)

{
  art_key_chunk_t *paVar1;
  _Bool _Var2;
  art_key_chunk_t *key;
  art_val_t *paVar3;
  leaf_t *in_RCX;
  container_t *container2;
  uint8_t typecode2;
  uint8_t typecode;
  container_t *container;
  undefined7 in_stack_ffffffffffffffb8;
  uint8_t in_stack_ffffffffffffffbf;
  undefined8 in_stack_ffffffffffffffc0;
  undefined6 in_stack_ffffffffffffffc8;
  uint8_t in_stack_ffffffffffffffce;
  uint8_t uVar4;
  leaf_t *local_8;
  
  if (in_RCX == (leaf_t *)0x0) {
    local_8 = (leaf_t *)0x0;
  }
  else {
    paVar1 = (art_key_chunk_t *)in_RCX->container;
    uVar4 = in_RCX->typecode;
    key = (art_key_chunk_t *)
          container_remove((container_t *)
                           CONCAT17(uVar4,CONCAT16(in_stack_ffffffffffffffce,
                                                   in_stack_ffffffffffffffc8)),
                           (uint16_t)((ulong)in_stack_ffffffffffffffc0 >> 0x30),
                           (uint8_t)((ulong)in_stack_ffffffffffffffc0 >> 0x28),
                           (uint8_t *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8))
    ;
    if (key != paVar1) {
      container_free(key,in_stack_ffffffffffffffbf);
      in_RCX->container = key;
      in_RCX->typecode = in_stack_ffffffffffffffce;
    }
    _Var2 = container_nonzero_cardinality
                      ((container_t *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8),
                       '\0');
    local_8 = in_RCX;
    if (!_Var2) {
      container_free(key,in_stack_ffffffffffffffbf);
      paVar3 = art_erase((art_t *)CONCAT17(uVar4,CONCAT16(in_stack_ffffffffffffffce,
                                                          in_stack_ffffffffffffffc8)),key);
      if (paVar3 != (art_val_t *)0x0) {
        free_leaf((leaf_t *)0x10d8b9);
      }
      local_8 = (leaf_t *)0x0;
    }
  }
  return local_8;
}

Assistant:

static inline leaf_t *containerptr_roaring64_bitmap_remove(
    roaring64_bitmap_t *r, uint8_t *high48, uint16_t low16, leaf_t *leaf) {
    if (leaf == NULL) {
        return NULL;
    }

    container_t *container = leaf->container;
    uint8_t typecode = leaf->typecode;
    uint8_t typecode2;
    container_t *container2 =
        container_remove(container, low16, typecode, &typecode2);
    if (container2 != container) {
        container_free(container, typecode);
        leaf->container = container2;
        leaf->typecode = typecode2;
    }
    if (!container_nonzero_cardinality(container2, typecode2)) {
        container_free(container2, typecode2);
        leaf = (leaf_t *)art_erase(&r->art, high48);
        if (leaf != NULL) {
            free_leaf(leaf);
        }
        return NULL;
    }
    return leaf;
}